

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_read_char(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  operand local_90;
  operand local_8c;
  code *local_88;
  operand local_7c;
  string no_buffer_read;
  string eof_lab;
  string error;
  
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&no_buffer_read,psVar1,in_RDX);
    std::__cxx11::string::operator=((string *)&error,(string *)&no_buffer_read);
    std::__cxx11::string::~string((string *)&no_buffer_read);
    no_buffer_read._M_dataplus._M_p._0_4_ = 5;
    eof_lab._M_dataplus._M_p._0_4_ = 0x14;
    local_88 = (code *)CONCAT44(local_88._4_4_,0x39);
    local_90 = AL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&no_buffer_read,(operand *)&eof_lab,(operand *)&local_88,
               (int *)&local_90);
    no_buffer_read._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&no_buffer_read,&error);
    jump_if_arg_is_not_block(code,RCX,R11,&error);
  }
  eof_lab._M_dataplus._M_p._0_4_ = 2;
  local_88 = (code *)CONCAT44(local_88._4_4_,0xb);
  local_90 = NUMBER;
  no_buffer_read._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&eof_lab,(operand *)&local_88,&local_90,
             (unsigned_long *)&no_buffer_read);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_port(code,RCX,R11,&error);
  }
  no_buffer_read._M_dataplus._M_p._0_4_ = 0x40;
  eof_lab._M_dataplus._M_p._0_4_ = 0x14;
  local_88._0_4_ = 0x1b;
  local_90 = MEM_R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&no_buffer_read,(operand *)&eof_lab,(operand *)&local_88,
             (int *)&local_90);
  no_buffer_read._M_dataplus._M_p._0_4_ = 0x40;
  eof_lab._M_dataplus._M_p._0_4_ = 0x18;
  local_88._0_4_ = 0x1b;
  local_90 = BYTE_MEM_R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&no_buffer_read,(operand *)&eof_lab,(operand *)&local_88,
             (int *)&local_90);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&no_buffer_read,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&eof_lab,psVar1,lab_00);
  local_88._0_4_ = 5;
  local_90 = R11;
  local_8c = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,&local_8c);
  local_88._0_4_ = 0x30;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_88,&no_buffer_read);
  local_88 = (code *)CONCAT44(local_88._4_4_,0x40);
  local_90 = R11;
  local_8c = MEM_RCX;
  local_7c = MEM_RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_90 = AH;
  local_8c = R11;
  local_7c = NUMBER;
  local_88 = (code *)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_90,&local_8c,&local_7c,(unsigned_long *)&local_88);
  local_88._0_4_ = 0x4b;
  local_90 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90);
  local_88._0_4_ = 0x4b;
  local_90 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90);
  local_88._0_4_ = 0x4b;
  local_90 = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90);
  local_88._0_4_ = 0x40;
  local_90 = RDI;
  local_8c = MEM_RCX;
  local_7c = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88._0_4_ = 0x4e;
  local_90 = RDI;
  local_8c = NUMBER;
  local_7c = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88._0_4_ = 0x40;
  local_90 = RDX;
  local_8c = MEM_RCX;
  local_7c = MEM_R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88._0_4_ = 0x4e;
  local_90 = RDX;
  local_8c = NUMBER;
  local_7c = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88._0_4_ = 0x40;
  local_90 = RSI;
  local_8c = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,&local_8c);
  local_88._0_4_ = 0;
  local_90 = RSI;
  local_8c = NUMBER;
  local_7c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  save_before_foreign_call(code);
  align_stack(code);
  local_88._0_4_ = 0x40;
  local_90 = R15;
  local_8c = R10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,&local_8c);
  local_88 = (code *)CONCAT44(local_88._4_4_,0x5c);
  local_90 = RAX;
  local_8c = local_90;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,&local_8c);
  local_90 = ST6;
  local_8c = R11;
  local_7c = NUMBER;
  local_88 = _skiwi_read;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_90,&local_8c,&local_7c,(unsigned_long *)&local_88);
  local_88._0_4_ = 4;
  local_90 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90);
  local_88._0_4_ = 0x40;
  local_90 = R10;
  local_8c = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,&local_8c);
  restore_stack(code);
  restore_after_foreign_call(code);
  local_88._0_4_ = 0x4a;
  local_90 = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90);
  local_88._0_4_ = 0x4a;
  local_90 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90);
  local_88._0_4_ = 0x4a;
  local_90 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90);
  local_88._0_4_ = 0x55;
  local_90 = RAX;
  local_8c = NUMBER;
  local_7c = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88._0_4_ = 0x40;
  local_90 = MEM_RCX;
  local_8c = BYTE_MEM_R15;
  local_7c = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,(int *)&local_8c,&local_7c);
  local_88._0_4_ = 5;
  local_90 = RAX;
  local_8c = NUMBER;
  local_7c = EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_88,&eof_lab);
  local_88._0_4_ = 0x5c;
  local_90 = R11;
  local_8c = local_90;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,&local_8c);
  local_88._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_88,&no_buffer_read);
  local_88._0_4_ = 0x40;
  local_90 = R15;
  local_8c = MEM_RCX;
  local_7c = MEM_RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88 = (code *)CONCAT44(local_88._4_4_,0x4e);
  local_90 = R11;
  local_8c = NUMBER;
  local_7c = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_90 = AH;
  local_8c = R15;
  local_7c = NUMBER;
  local_88 = (code *)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_90,&local_8c,&local_7c,(unsigned_long *)&local_88);
  local_88 = (code *)((ulong)local_88 & 0xffffffff00000000);
  local_90 = R11;
  local_8c = NUMBER;
  local_7c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88 = (code *)((ulong)local_88 & 0xffffffff00000000);
  local_90 = R15;
  local_8c = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,&local_8c);
  local_88._0_4_ = 0x40;
  local_90 = AL;
  local_8c = BYTE_MEM_R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,&local_8c);
  local_88._0_4_ = 0x44;
  local_90 = RAX;
  local_8c = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,&local_8c);
  local_88._0_4_ = 0x55;
  local_90 = RAX;
  local_8c = NUMBER;
  local_7c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88._0_4_ = 0x49;
  local_90 = RAX;
  local_8c = NUMBER;
  local_7c = R14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88._0_4_ = 0x58;
  local_90 = R11;
  local_8c = NUMBER;
  local_7c = DL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88._0_4_ = 0x55;
  local_90 = R11;
  local_8c = NUMBER;
  local_7c = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88._0_4_ = 0x40;
  local_90 = MEM_RCX;
  local_8c = MEM_R15;
  local_7c = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90,(int *)&local_8c,&local_7c);
  local_88._0_4_ = 0x2c;
  local_90 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90);
  local_88._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_88,&eof_lab);
  local_88._0_4_ = 0x40;
  local_90 = RAX;
  local_8c = NUMBER;
  local_7c = XMM4;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_88,&local_90,&local_8c,(int *)&local_7c);
  local_88 = (code *)CONCAT44(local_88._4_4_,0x2c);
  local_90 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_88,&local_90);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_read_char_contract_violation);
  }
  std::__cxx11::string::~string((string *)&eof_lab);
  std::__cxx11::string::~string((string *)&no_buffer_read);
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_read_char(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_port(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::R11, asmcode::MEM_RCX, CELLS(5));
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RCX, CELLS(7)); // get the number of bytes read

  // rcx contains port
  // r11 contains index
  // r15 contains number of bytes read

  auto no_buffer_read = label_to_string(label++);
  auto eof_lab = label_to_string(label++);
  code.add(asmcode::CMP, asmcode::R11, asmcode::R15);
  code.add(asmcode::JL, no_buffer_read);
  // start reading buffer
  code.add(asmcode::MOV, asmcode::R11, asmcode::MEM_RCX, CELLS(4)); // pointer to string
  code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);

#ifdef _WIN32
  code.add(asmcode::PUSH, asmcode::RCX);
  code.add(asmcode::PUSH, asmcode::RDX);
  code.add(asmcode::PUSH, asmcode::R8);

  code.add(asmcode::MOV, asmcode::R8, asmcode::MEM_RCX, CELLS(5)); // index
  code.add(asmcode::SAR, asmcode::R8, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RCX, CELLS(3)); // filehandle
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);

#else
  code.add(asmcode::PUSH, asmcode::RDI);
  code.add(asmcode::PUSH, asmcode::RSI);
  code.add(asmcode::PUSH, asmcode::RDX);

  code.add(asmcode::MOV, asmcode::RDI, asmcode::MEM_RCX, CELLS(3)); // filehandle
  code.add(asmcode::SAR, asmcode::RDI, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_RCX, CELLS(5)); // index
  code.add(asmcode::SAR, asmcode::RDX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::RSI, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RSI, asmcode::NUMBER, CELLS(1));
#endif

  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_read);
#else
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_read);
#endif  
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);

#ifdef _WIN32
  code.add(asmcode::POP, asmcode::R8);
  code.add(asmcode::POP, asmcode::RDX);
  code.add(asmcode::POP, asmcode::RCX);
#else
  code.add(asmcode::POP, asmcode::RDX);
  code.add(asmcode::POP, asmcode::RSI);
  code.add(asmcode::POP, asmcode::RDI);
#endif
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::MEM_RCX, CELLS(7), asmcode::RAX); // store the number of bytes read
  code.add(asmcode::CMP, asmcode::RAX, asmcode::NUMBER, 0);
  code.add(asmcode::JES, eof_lab);
  code.add(asmcode::XOR, asmcode::R11, asmcode::R11);
  code.add(asmcode::LABEL, no_buffer_read);
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RCX, CELLS(4));
  code.add(asmcode::SAR, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::AND, asmcode::R15, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8); // get address to string
  code.add(asmcode::ADD, asmcode::R11, asmcode::NUMBER, 8); // increase 8 for header
  code.add(asmcode::ADD, asmcode::R15, asmcode::R11);
  code.add(asmcode::MOV, asmcode::AL, asmcode::BYTE_MEM_R15);
  code.add(asmcode::MOVZX, asmcode::RAX, asmcode::AL);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, char_tag);

  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 7);
  code.add(asmcode::SHL, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::MEM_RCX, CELLS(5), asmcode::R11); //update index

  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, eof_lab);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, eof_tag);
  code.add(asmcode::JMP, CONTINUE);

  if (ops.safe_primitives)
    {
    error_label(code, error, re_read_char_contract_violation);
    }
  }